

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O3

int32_t duckdb::Date::ExtractWeekNumberRegular(date_t date,bool monday_first)

{
  date_t dVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  undefined1 *puVar5;
  int iVar6;
  int iVar7;
  int32_t year;
  int local_34;
  int local_30;
  uint local_2c;
  
  Convert(date,(int32_t *)&local_2c,&local_30,&local_34);
  if ((local_2c & 3) == 0) {
    uVar4 = local_2c * -0x3d70a3d7 + 0x51eb850;
    iVar6 = (int)((long)local_30 + -1);
    if ((uVar4 >> 2 | local_2c * 0x40000000) < 0x28f5c29) {
      if ((uVar4 >> 4 | local_2c * -0x70000000) < 0xa3d70b) {
        puVar5 = CUMULATIVE_LEAP_DAYS;
      }
      else {
        puVar5 = CUMULATIVE_DAYS;
      }
      piVar3 = (int *)(puVar5 + (long)iVar6 * 4);
    }
    else {
      piVar3 = (int *)(CUMULATIVE_LEAP_DAYS + (long)iVar6 * 4);
    }
  }
  else {
    piVar3 = (int *)(CUMULATIVE_DAYS + ((long)local_30 + -1) * 4);
  }
  iVar6 = local_34 + -1 + *piVar3;
  dVar1 = FromDate(local_2c,1,1);
  if (dVar1.days < 0) {
    uVar4 = (3U - dVar1.days) % 7 ^ 7;
  }
  else {
    uVar4 = ((dVar1.days + 3U) / 7) * -7 + dVar1.days + 4;
  }
  iVar2 = 0;
  iVar7 = 8 - uVar4;
  if (uVar4 == 1) {
    iVar7 = iVar2;
  }
  if (!monday_first) {
    iVar7 = 7 - uVar4;
  }
  if (iVar7 <= iVar6) {
    iVar2 = (iVar6 - iVar7) / 7 + 1;
  }
  return iVar2;
}

Assistant:

int32_t Date::ExtractWeekNumberRegular(date_t date, bool monday_first) {
	int32_t year, month, day;
	Date::Convert(date, year, month, day);
	month -= 1;
	day -= 1;
	// get the day of the year
	auto day_of_the_year =
	    (Date::IsLeapYear(year) ? Date::CUMULATIVE_LEAP_DAYS[month] : Date::CUMULATIVE_DAYS[month]) + day;
	// now figure out the first monday or sunday of the year
	// what day is January 1st?
	auto day_of_jan_first = Date::ExtractISODayOfTheWeek(Date::FromDate(year, 1, 1));
	// monday = 1, sunday = 7
	int32_t first_week_start;
	if (monday_first) {
		// have to find next "1"
		if (day_of_jan_first == 1) {
			// jan 1 is monday: starts immediately
			first_week_start = 0;
		} else {
			// jan 1 is not monday: count days until next monday
			first_week_start = 8 - day_of_jan_first;
		}
	} else {
		first_week_start = 7 - day_of_jan_first;
	}
	if (day_of_the_year < first_week_start) {
		// day occurs before first week starts: week 0
		return 0;
	}
	return ((day_of_the_year - first_week_start) / 7) + 1;
}